

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::SetCommonOneofFieldVariables
          (FieldGeneratorBase *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variables)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  mapped_type *pmVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  long *plVar8;
  ulong uVar9;
  undefined8 uVar10;
  key_type local_130;
  string local_110;
  long *local_f0;
  undefined8 local_e8;
  long local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  string local_b0;
  string local_90;
  key_type local_70;
  string local_50;
  
  UnderscoresToCamelCase
            (&local_110,(string *)**(undefined8 **)(this->descriptor_ + 0x60),false,false);
  paVar2 = &local_130.field_2;
  local_130._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"oneof_name","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_130);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_110.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar3) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  UnderscoresToCamelCase
            (&local_50,(string *)**(undefined8 **)(this->descriptor_ + 0x60),false,false);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_c0 = *puVar7;
    lStack_b8 = plVar5[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar7;
    local_d0 = (ulong *)*plVar5;
  }
  local_c8 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  UnderscoresToCamelCase(&local_90,(string *)**(undefined8 **)(this->descriptor_ + 0x60),true,false)
  ;
  uVar9 = 0xf;
  if (local_d0 != &local_c0) {
    uVar9 = local_c0;
  }
  if (uVar9 < local_90._M_string_length + local_c8) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar10 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_90._M_string_length + local_c8) goto LAB_00265a8c;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_d0);
  }
  else {
LAB_00265a8c:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90._M_dataplus._M_p);
  }
  local_f0 = &local_e0;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_e0 = *plVar5;
    uStack_d8 = puVar6[3];
  }
  else {
    local_e0 = *plVar5;
    local_f0 = (long *)*puVar6;
  }
  local_e8 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
  plVar8 = plVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar8) {
    local_130.field_2._M_allocated_capacity = *plVar8;
    local_130.field_2._8_8_ = plVar5[3];
    local_130._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_130.field_2._M_allocated_capacity = *plVar8;
    local_130._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_130._M_string_length = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  GetPropertyName_abi_cxx11_
            (&local_b0,(csharp *)this->descriptor_,(FieldDescriptor *)local_130._M_string_length);
  uVar10 = (FieldDescriptor *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar2) {
    uVar10 = local_130.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < (FieldDescriptor *)(local_130._M_string_length + local_b0._M_string_length)) {
    uVar10 = (FieldDescriptor *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar10 = local_b0.field_2._M_allocated_capacity;
    }
    if ((FieldDescriptor *)(local_130._M_string_length + local_b0._M_string_length) <= (ulong)uVar10
       ) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_b0,0,(char *)0x0,(ulong)local_130._M_dataplus._M_p);
      goto LAB_00265bc3;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_b0._M_dataplus._M_p);
LAB_00265bc3:
  psVar1 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_110.field_2._M_allocated_capacity = *psVar1;
    local_110.field_2._8_4_ = *(undefined4 *)(puVar6 + 3);
    local_110.field_2._12_4_ = *(undefined4 *)((long)puVar6 + 0x1c);
    local_110._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar1;
    local_110._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_110._M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"has_property_check","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_70);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar3) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,(ulong)(local_b0.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar2) {
    operator_delete(local_130._M_dataplus._M_p,(ulong)(local_130.field_2._M_allocated_capacity + 1))
    ;
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  UnderscoresToCamelCase
            (&local_110,(string *)**(undefined8 **)(this->descriptor_ + 0x60),true,false);
  local_130._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"oneof_property_name","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_130);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar2) {
    operator_delete(local_130._M_dataplus._M_p,(ulong)(local_130.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar3) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FieldGeneratorBase::SetCommonOneofFieldVariables(
    map<string, string>* variables) {
  (*variables)["oneof_name"] = oneof_name();
  (*variables)["has_property_check"] =
    oneof_name() + "Case_ == " + oneof_property_name() +
    "OneofCase." + property_name();
  (*variables)["oneof_property_name"] = oneof_property_name();
}